

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O0

void __thiscall
Gudhi::
Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::Simplex_tree_optimized_star_simplex_iterator
          (Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *cpx,
          Static_vertex_vector *simp)

{
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *pSVar1;
  type_conflict5 tVar2;
  bool bVar3;
  reference piVar4;
  Siblings *pSVar5;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_58;
  Siblings *local_50;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_48;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_40;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_38 [3];
  Static_vertex_vector *local_20;
  Static_vertex_vector *simp_local;
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *cpx_local;
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  *this_local;
  
  this->st_ = cpx;
  local_20 = simp;
  simp_local = (Static_vertex_vector *)cpx;
  cpx_local = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)this;
  Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  ::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator(&this->it_,cpx,simp);
  Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  ::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator(&this->end_);
  piVar4 = boost::iterators::detail::
           iterator_facade_base<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
           ::operator*((iterator_facade_base<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                        *)&this->it_);
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  ::iterator_from_iiterator(&this->sh_,piVar4);
  pSVar1 = this->st_;
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  ::iterator_from_iiterator(local_38,&this->sh_);
  pSVar5 = Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
           self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                     (pSVar1,local_38);
  this->sib_ = pSVar5;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_stack_).
  super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*>_>
  ::vector(&this->children_stack_);
  tVar2 = boost::iterators::operator==
                    ((iterator_facade<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                      *)&this->it_,
                     (iterator_facade<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                      *)&this->end_);
  if (tVar2) {
    this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  }
  else {
    this->is_root_ = true;
    piVar4 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                          *)&this->it_);
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::operator=(&this->sh_,piVar4);
    pSVar1 = this->st_;
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_40,&this->sh_);
    pSVar5 = Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
             self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                       (pSVar1,&local_40);
    this->sib_ = pSVar5;
    pSVar1 = this->st_;
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_48,&this->sh_);
    bVar3 = Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
            has_children<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                      (pSVar1,&local_48);
    if (bVar3) {
      pSVar1 = this->st_;
      boost::container::dtl::
      iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
      ::iterator_from_iiterator(&local_58,&this->sh_);
      local_50 = Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::children(pSVar1,&local_58)
      ;
      std::
      vector<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>_*>_>
      ::push_back(&this->children_stack_,&local_50);
    }
  }
  return;
}

Assistant:

Simplex_tree_optimized_star_simplex_iterator(SimplexTree const* cpx, Static_vertex_vector&& simp)
      : st_(cpx), it_(cpx, std::move(simp)), end_(), sh_(*it_), sib_(st_->self_siblings(sh_)), children_stack_() {
    if (it_ == end_) {
      st_ = nullptr;
      return;
    }  // no coface subtree => end()
    is_root_ = true;
    sh_ = *it_;                      // sh_ is the root
    sib_ = st_->self_siblings(sh_);  // Siblings containing sh_
    if (st_->has_children(sh_)) {
      children_stack_.push_back(st_->children(sh_));
    }
    return;  // first root of coface subtree
  }